

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmathlib.c
# Opt level: O2

int math_log(lua_State *L)

{
  int iVar1;
  lua_Number lVar2;
  lua_Number __x;
  double dVar3;
  double dVar4;
  
  lVar2 = luaL_checknumber(L,1);
  iVar1 = lua_type(L,2);
  if (iVar1 < 1) {
    lVar2 = log(lVar2);
  }
  else {
    __x = luaL_checknumber(L,2);
    if ((__x != 2.0) || (NAN(__x))) {
      if ((__x != 10.0) || (NAN(__x))) {
        dVar3 = log(lVar2);
        dVar4 = log(__x);
        lVar2 = dVar3 / dVar4;
      }
      else {
        lVar2 = log10(lVar2);
      }
    }
    else {
      lVar2 = log2(lVar2);
    }
  }
  lua_pushnumber(L,lVar2);
  return 1;
}

Assistant:

static int math_log (lua_State *L) {
  lua_Number x = luaL_checknumber(L, 1);
  lua_Number res;
  if (lua_isnoneornil(L, 2))
    res = l_mathop(log)(x);
  else {
    lua_Number base = luaL_checknumber(L, 2);
#if !defined(LUA_USE_C89)
    if (base == l_mathop(2.0))
      res = l_mathop(log2)(x);
    else
#endif
    if (base == l_mathop(10.0))
      res = l_mathop(log10)(x);
    else
      res = l_mathop(log)(x)/l_mathop(log)(base);
  }
  lua_pushnumber(L, res);
  return 1;
}